

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O0

Vec_Mem_t * If_DeriveHashTable6(int nVars,word uTruth)

{
  word wVar1;
  uint uVar2;
  Vec_Mem_t *p_00;
  ulong local_78;
  int local_6c;
  int local_68;
  int c;
  int p;
  int i;
  Vec_Mem_t *vTtMem6;
  word tTemp2;
  word tTemp1;
  word tCur;
  word Canon;
  int *pPerm;
  int *pComp;
  int local_20;
  int nPerms;
  int nMints;
  int fVerbose;
  word uTruth_local;
  int nVars_local;
  
  nPerms = 0;
  local_20 = 1 << ((byte)nVars & 0x1f);
  _nMints = uTruth;
  uTruth_local._4_4_ = nVars;
  pComp._4_4_ = Extra_Factorial(nVars);
  pPerm = Extra_GreyCodeSchedule(uTruth_local._4_4_);
  Canon = (word)Extra_PermSchedule(uTruth_local._4_4_);
  tCur = 0xffffffffffffffff;
  p_00 = Vec_MemAllocForTTSimple(uTruth_local._4_4_);
  c = 0;
  do {
    if (1 < c) {
      if (pPerm != (int *)0x0) {
        free(pPerm);
        pPerm = (int *)0x0;
      }
      if (Canon != 0) {
        free((void *)Canon);
        Canon = 0;
      }
      if (nPerms != 0) {
        Extra_PrintHex(_stdout,(uint *)&nMints,uTruth_local._4_4_);
        printf("\n");
        Extra_PrintHex(_stdout,(uint *)&tCur,uTruth_local._4_4_);
        printf("\n");
        uVar2 = Vec_MemEntryNum(p_00);
        printf("Members = %d.\n",(ulong)uVar2);
      }
      return p_00;
    }
    if (c == 0) {
      local_78 = _nMints;
    }
    else {
      local_78 = _nMints ^ 0xffffffffffffffff;
    }
    tTemp1 = local_78;
    for (local_68 = 0; wVar1 = tTemp1, local_68 < pComp._4_4_; local_68 = local_68 + 1) {
      for (local_6c = 0; local_6c < local_20; local_6c = local_6c + 1) {
        if (tTemp1 < tCur) {
          tCur = tTemp1;
        }
        Vec_MemHashInsert(p_00,&tTemp1);
        tTemp1 = Abc_Tt6Flip(tTemp1,pPerm[local_6c]);
      }
      if (wVar1 != tTemp1) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                      ,0x171,"Vec_Mem_t *If_DeriveHashTable6(int, word)");
      }
      tTemp1 = Abc_Tt6SwapAdjacent(tTemp1,*(int *)(Canon + (long)local_68 * 4));
    }
    if (local_78 != tTemp1) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                    ,0x174,"Vec_Mem_t *If_DeriveHashTable6(int, word)");
    }
    c = c + 1;
  } while( true );
}

Assistant:

Vec_Mem_t * If_DeriveHashTable6( int nVars, word uTruth )
{
    int fVerbose = 0;
    int nMints   = (1 << nVars);
    int nPerms   = Extra_Factorial( nVars );
    int * pComp  = Extra_GreyCodeSchedule( nVars );
    int * pPerm  = Extra_PermSchedule( nVars );
    word Canon   = ABC_CONST(0xFFFFFFFFFFFFFFFF);
    word tCur, tTemp1, tTemp2;
    Vec_Mem_t * vTtMem6 = Vec_MemAllocForTTSimple( nVars );
    int i, p, c;
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                if ( Canon > tCur )
                    Canon = tCur;
                Vec_MemHashInsert( vTtMem6, &tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    ABC_FREE( pComp );
    ABC_FREE( pPerm );
    if ( fVerbose )
    {
/*
        word * pEntry;
        Vec_MemForEachEntry( vTtMem6, pEntry, i )
        {
            Extra_PrintHex( stdout, (unsigned*)pEntry, nVars );  
            printf( ", " );
            if ( i % 4 == 3 )
                printf( "\n" );
        }
*/
        Extra_PrintHex( stdout, (unsigned*)&uTruth, nVars );  printf( "\n" );
        Extra_PrintHex( stdout, (unsigned*)&Canon,  nVars );  printf( "\n" );
        printf( "Members = %d.\n", Vec_MemEntryNum(vTtMem6) );
    }
    return vTtMem6;
}